

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O1

bool duckdb::DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<long>,false>
               (DecimalCastData<long> *state,int32_t exponent)

{
  bool bVar1;
  uint uVar2;
  byte bVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar5 = 0;
  uVar2 = (uint)state->decimal_count - (uint)state->scale;
  if (state->decimal_count <= state->scale) {
    uVar2 = uVar5;
  }
  if (exponent < 1) {
    if (exponent < 0) {
      state->exponent_type = NEGATIVE;
      uVar5 = exponent;
    }
  }
  else {
    state->exponent_type = POSITIVE;
    if (uVar2 - exponent == 0 || (int)uVar2 < exponent) {
      uVar5 = exponent - uVar2;
    }
    else {
      state->excessive_decimals = (uint8_t)(uVar2 - exponent);
    }
  }
  bVar1 = Finalize<duckdb::DecimalCastData<long>,false>(state);
  if (bVar1) {
    bVar1 = uVar5 == 0;
    if ((int)uVar5 < 0) {
      lVar7 = (long)(int)uVar5;
      lVar6 = state->result;
      do {
        lVar4 = lVar6;
        lVar7 = lVar7 + 1;
        if (lVar4 + 9U < 0x13) break;
        lVar6 = lVar4 / 10;
      } while (lVar7 != 0);
      state->result = lVar4 / 10;
      bVar1 = true;
      if (4 < lVar4 % 10) {
        state->result = state->result + 1;
      }
    }
    else if (!bVar1) {
      bVar3 = state->digit_count;
      lVar6 = state->result;
      uVar8 = 1;
      do {
        if (lVar6 != 0) {
          if ((uint)state->width - (uint)state->scale == (uint)bVar3) {
            return bVar1;
          }
          bVar3 = bVar3 + 1;
          state->digit_count = bVar3;
          if (0xccccccccccccccc < lVar6) {
            return bVar1;
          }
          lVar6 = lVar6 * 10;
          state->result = lVar6;
        }
        bVar1 = uVar5 <= uVar8;
        bVar9 = uVar8 != uVar5;
        uVar8 = uVar8 + 1;
      } while (bVar9);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool HandleExponent(T &state, int32_t exponent) {
		auto decimal_excess = (state.decimal_count > state.scale) ? state.decimal_count - state.scale : 0;
		if (exponent > 0) {
			state.exponent_type = ExponentType::POSITIVE;
			// Positive exponents need up to 'exponent' amount of digits
			// Everything beyond that amount needs to be truncated
			if (decimal_excess > exponent) {
				// We've allowed too many decimals
				state.excessive_decimals = UnsafeNumericCast<uint8_t>(decimal_excess - exponent);
				exponent = 0;
			} else {
				exponent -= decimal_excess;
			}
			D_ASSERT(exponent >= 0);
		} else if (exponent < 0) {
			state.exponent_type = ExponentType::NEGATIVE;
		}
		if (!Finalize<T, NEGATIVE>(state)) {
			return false;
		}
		if (exponent < 0) {
			bool round_up = false;
			for (idx_t i = 0; i < idx_t(-int64_t(exponent)); i++) {
				auto mod = state.result % 10;
				round_up = NEGATIVE ? mod <= -5 : mod >= 5;
				state.result /= 10;
				if (state.result == 0) {
					break;
				}
			}
			if (round_up) {
				RoundUpResult<T, NEGATIVE>(state);
			}
			return true;
		} else {
			// positive exponent: append 0's
			for (idx_t i = 0; i < idx_t(exponent); i++) {
				if (!HandleDigit<T, NEGATIVE>(state, 0)) {
					return false;
				}
			}
			return true;
		}
	}